

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::Rollup::CreateDiffModeRollupOutput
          (Rollup *this,Rollup *base,Options *options,RollupOutput *output)

{
  long in_RCX;
  long *in_RSI;
  undefined8 *in_RDI;
  RollupRow *row;
  RollupRow *in_stack_00000038;
  Rollup *in_stack_00000040;
  
  *(undefined8 *)(in_RCX + 0x38) = *in_RDI;
  *(undefined8 *)(in_RCX + 0x40) = in_RDI[1];
  *(undefined8 *)(in_RCX + 0x48) = in_RDI[2];
  *(undefined8 *)(in_RCX + 0x50) = in_RDI[3];
  *(undefined8 *)(in_RCX + 0x68) = 0x4059000000000000;
  *(undefined8 *)(in_RCX + 0x70) = 0x4059000000000000;
  if (in_RSI != (long *)0x0) {
    *(long *)(in_RCX + 0x38) = *(long *)(in_RCX + 0x38) - *in_RSI;
    *(long *)(in_RCX + 0x40) = *(long *)(in_RCX + 0x40) - in_RSI[1];
  }
  *(undefined1 *)(in_RCX + 0xc0) = 1;
  CreateRows(in_stack_00000040,in_stack_00000038,this,(Options *)base,options._7_1_);
  return;
}

Assistant:

void CreateDiffModeRollupOutput(Rollup* base, const Options& options,
                                  RollupOutput* output) const {
    RollupRow* row = &output->toplevel_row_;
    row->size.vm = vm_total_;
    row->size.file = file_total_;
    row->filtered_size.vm = filtered_vm_total_;
    row->filtered_size.file = filtered_file_total_;
    row->vmpercent = 100;
    row->filepercent = 100;
    if (base) {
      row->size.vm -= base->vm_total_;
      row->size.file -= base->file_total_;
    }
    output->diff_mode_ = true;
    CreateRows(row, base, options, true);
  }